

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int EmitRescaledRGB(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  int iVar2;
  WebPDecParams *in_RSI;
  long in_RDI;
  int v_lines_in;
  int u_lines_in;
  int y_lines_in;
  int num_lines_out;
  int uv_j;
  int j;
  int uv_mb_h;
  int mb_h;
  int src_stride;
  int iVar3;
  int iVar4;
  int num_lines;
  
  num_lines = *(int *)(in_RDI + 0x10);
  iVar1 = num_lines + 1;
  iVar4 = 0;
  iVar3 = 0;
  src_stride = 0;
  while (iVar4 < num_lines) {
    iVar2 = WebPRescalerImport((WebPRescaler *)in_RSI,num_lines,(uint8_t *)CONCAT44(iVar4,iVar3),
                               src_stride);
    iVar4 = iVar2 + iVar4;
    iVar2 = WebPRescaleNeededLines(in_RSI->scaler_u,(iVar1 >> 1) - iVar3);
    if (iVar2 != 0) {
      iVar2 = WebPRescalerImport((WebPRescaler *)in_RSI,num_lines,(uint8_t *)CONCAT44(iVar4,iVar3),
                                 src_stride);
      WebPRescalerImport((WebPRescaler *)in_RSI,num_lines,(uint8_t *)CONCAT44(iVar4,iVar3),
                         src_stride);
      iVar3 = iVar2 + iVar3;
    }
    iVar2 = ExportRGB(in_RSI,num_lines);
    src_stride = iVar2 + src_stride;
  }
  return src_stride;
}

Assistant:

static int EmitRescaledRGB(const VP8Io* const io, WebPDecParams* const p) {
  const int mb_h = io->mb_h;
  const int uv_mb_h = (mb_h + 1) >> 1;
  int j = 0, uv_j = 0;
  int num_lines_out = 0;
  while (j < mb_h) {
    const int y_lines_in =
        WebPRescalerImport(p->scaler_y, mb_h - j,
                           io->y + (ptrdiff_t)j * io->y_stride, io->y_stride);
    j += y_lines_in;
    if (WebPRescaleNeededLines(p->scaler_u, uv_mb_h - uv_j)) {
      const int u_lines_in = WebPRescalerImport(
          p->scaler_u, uv_mb_h - uv_j, io->u + (ptrdiff_t)uv_j * io->uv_stride,
          io->uv_stride);
      const int v_lines_in = WebPRescalerImport(
          p->scaler_v, uv_mb_h - uv_j, io->v + (ptrdiff_t)uv_j * io->uv_stride,
          io->uv_stride);
      (void)v_lines_in;   // remove a gcc warning
      assert(u_lines_in == v_lines_in);
      uv_j += u_lines_in;
    }
    num_lines_out += ExportRGB(p, p->last_y + num_lines_out);
  }
  return num_lines_out;
}